

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O2

yyjson_mut_val *
duckdb_yyjson::unsafe_yyjson_mut_ptr_getx
          (yyjson_mut_val *val,char *ptr,size_t ptr_len,yyjson_ptr_ctx *ctx,yyjson_ptr_err *err)

{
  byte *__s2;
  byte bVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  char *pcVar5;
  yyjson_ptr_code yVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *__n;
  long lVar9;
  bool bVar10;
  yyjson_mut_val *pyVar11;
  byte *pbVar12;
  byte bVar13;
  ulong uVar14;
  yyjson_mut_val *pyVar15;
  bool bVar16;
  bool bVar17;
  
  pbVar8 = (byte *)(ptr + ptr_len);
  pyVar15 = (yyjson_mut_val *)0x0;
  bVar10 = false;
  pbVar7 = (byte *)ptr;
  do {
    __s2 = pbVar7 + 1;
    for (__n = (byte *)0x0;
        ((pbVar12 = __n + (long)__s2, pbVar12 < pbVar8 && (*pbVar12 != 0x2f)) && (*pbVar12 != 0x7e))
        ; __n = __n + 1) {
    }
    bVar17 = true;
    if ((pbVar12 != pbVar8) && (*pbVar12 == 0x7e)) {
      uVar14 = ~(ulong)pbVar7;
      lVar9 = 0;
      while( true ) {
        __n = pbVar12 + uVar14;
        do {
          pbVar7 = pbVar12;
          if ((pbVar8 <= pbVar7) || (*pbVar7 == 0x2f)) {
            bVar17 = lVar9 == 0;
            pbVar12 = pbVar7;
            goto LAB_00f0a844;
          }
          pbVar12 = pbVar7 + 1;
          __n = __n + 1;
        } while (*pbVar7 != 0x7e);
        if ((pbVar12 == pbVar8) || ((*pbVar12 & 0xfe) != 0x30)) break;
        lVar9 = lVar9 + 1;
        uVar14 = uVar14 - 1;
      }
      if (err == (yyjson_ptr_err *)0x0) {
        return (yyjson_mut_val *)0x0;
      }
      pcVar5 = "invalid escaped character";
      yVar6 = 2;
      goto LAB_00f0ab00;
    }
LAB_00f0a844:
    uVar14 = val->tag;
    bVar13 = (byte)uVar14 & 7;
    if (bVar13 == 7) {
      if (0xff < uVar14) {
        uVar14 = uVar14 >> 8;
        pyVar11 = (yyjson_mut_val *)(val->uni).u64;
LAB_00f0a87c:
        do {
          do {
            pyVar15 = pyVar11;
            bVar16 = uVar14 == 0;
            uVar14 = uVar14 - 1;
            if (bVar16) {
              pyVar15 = (yyjson_mut_val *)0x0;
              pyVar11 = (yyjson_mut_val *)0x0;
              goto LAB_00f0aa8f;
            }
            pyVar11 = pyVar15->next->next;
          } while ((byte *)(pyVar11->tag >> 8) != __n);
          if (!bVar17) {
            pbVar4 = (byte *)0x0;
            pbVar7 = __s2;
            do {
              if (__n == pbVar4) goto LAB_00f0a951;
              bVar1 = *(byte *)((long)(pyVar11->uni).ptr + (long)pbVar4);
              if (*pbVar7 == 0x7e) {
                bVar2 = 0x2f;
                if (pbVar7[1] == 0x30) {
                  bVar2 = 0x7e;
                }
                if (bVar2 != bVar1) goto LAB_00f0a87c;
                pbVar7 = pbVar7 + 1;
              }
              else if (bVar1 != *pbVar7) goto LAB_00f0a87c;
              pbVar7 = pbVar7 + 1;
              pbVar4 = pbVar4 + 1;
            } while( true );
          }
          iVar3 = bcmp((pyVar11->uni).ptr,__s2,(size_t)__n);
        } while (iVar3 != 0);
LAB_00f0a951:
        pyVar11 = pyVar11->next;
        goto LAB_00f0aa8f;
      }
      if ((ctx != (yyjson_ptr_ctx *)0x0) && (pbVar12 == pbVar8)) {
        pyVar15 = (yyjson_mut_val *)0x0;
        pyVar11 = (yyjson_mut_val *)0x0;
        goto LAB_00f0aacf;
      }
LAB_00f0aaec:
      if (err == (yyjson_ptr_err *)0x0) {
        return (yyjson_mut_val *)0x0;
      }
      pcVar5 = "JSON pointer cannot be resolved";
      yVar6 = 3;
      pbVar7 = __s2;
LAB_00f0ab00:
      err->code = yVar6;
      err->msg = pcVar5;
      err->pos = (long)pbVar7 - (long)ptr;
      return (yyjson_mut_val *)0x0;
    }
    if (bVar13 == 6) {
      if (uVar14 < 0x100) {
        if ((__n != (byte *)0x1) || ((*__s2 != 0x30 && (*__s2 != 0x2d)))) goto LAB_00f0aa81;
        bVar10 = true;
      }
      else {
        if (__n + -0x14 < (byte *)0xffffffffffffffed) {
LAB_00f0aa81:
          pyVar15 = (yyjson_mut_val *)0x0;
          bVar10 = false;
          goto LAB_00f0aa8d;
        }
        pyVar15 = (yyjson_mut_val *)(val->uni).u64;
        if (*__s2 == 0x2d) {
          pyVar11 = (yyjson_mut_val *)0xffffffffffffffff;
          if ((byte *)0x1 < __n) goto LAB_00f0aa81;
        }
        else if (*__s2 == 0x30) {
          pyVar11 = (yyjson_mut_val *)0x0;
          if ((byte *)0x1 < __n) {
            pyVar15 = (yyjson_mut_val *)0x0;
            bVar10 = false;
            goto LAB_00f0aa8f;
          }
        }
        else {
          pyVar11 = (yyjson_mut_val *)0x0;
          for (pbVar7 = __s2; pbVar7 < __n + (long)__s2; pbVar7 = pbVar7 + 1) {
            if (9 < (ulong)*pbVar7 - 0x30) goto LAB_00f0aa81;
            pyVar11 = (yyjson_mut_val *)(((ulong)*pbVar7 - 0x30) + (long)pyVar11 * 10);
          }
          if (pyVar11 == (yyjson_mut_val *)0x0) goto LAB_00f0aa81;
        }
        bVar10 = pyVar11 == (yyjson_mut_val *)0xffffffffffffffff ||
                 pyVar11 == (yyjson_mut_val *)(uVar14 >> 8);
        if (pyVar11 < (yyjson_mut_val *)(uVar14 >> 8)) {
          while (bVar17 = pyVar11 != (yyjson_mut_val *)0x0,
                pyVar11 = (yyjson_mut_val *)((long)&pyVar11[-1].next + 7), bVar17) {
            pyVar15 = pyVar15->next;
          }
          pyVar11 = pyVar15->next;
          goto LAB_00f0aa8f;
        }
      }
      pyVar15 = (yyjson_mut_val *)0x0;
    }
LAB_00f0aa8d:
    pyVar11 = (yyjson_mut_val *)0x0;
LAB_00f0aa8f:
    bVar17 = pbVar12 == pbVar8;
    if ((ctx != (yyjson_ptr_ctx *)0x0) && (pbVar12 == pbVar8)) {
      if (bVar13 != 7) {
        bVar17 = true;
        if (bVar13 != 6) goto LAB_00f0aad9;
        if (pyVar11 == (yyjson_mut_val *)0x0 && !bVar10) goto LAB_00f0aaec;
        bVar10 = (bool)(pyVar11 == (yyjson_mut_val *)0x0 | bVar10);
      }
LAB_00f0aacf:
      ctx->ctn = val;
      ctx->pre = pyVar15;
      bVar17 = true;
    }
LAB_00f0aad9:
    if (pyVar11 == (yyjson_mut_val *)0x0) goto LAB_00f0aaec;
    val = pyVar11;
    pbVar7 = pbVar12;
    if (bVar17) {
      return pyVar11;
    }
  } while( true );
}

Assistant:

yyjson_mut_val *unsafe_yyjson_mut_ptr_getx(yyjson_mut_val *val,
                                           const char *ptr,
                                           size_t ptr_len,
                                           yyjson_ptr_ctx *ctx,
                                           yyjson_ptr_err *err) {

    const char *hdr = ptr, *end = ptr + ptr_len, *token;
    usize len, esc;
    yyjson_mut_val *ctn, *pre = NULL;
    yyjson_type type;
    bool idx_is_last = false;

    while (true) {
        token = ptr_next_token(&ptr, end, &len, &esc);
        if (unlikely(!token)) return_err_syntax(NULL, ptr - hdr);
        ctn = val;
        type = unsafe_yyjson_get_type(val);
        if (type == YYJSON_TYPE_OBJ) {
            val = ptr_mut_obj_get(val, token, len, esc, &pre);
        } else if (type == YYJSON_TYPE_ARR) {
            val = ptr_mut_arr_get(val, token, len, esc, &pre, &idx_is_last);
        } else {
            val = NULL;
        }
        if (ctx && (ptr == end)) {
            if (type == YYJSON_TYPE_OBJ ||
                (type == YYJSON_TYPE_ARR && (val || idx_is_last))) {
                ctx->ctn = ctn;
                ctx->pre = pre;
            }
        }
        if (!val) return_err_resolve(NULL, token - hdr);
        if (ptr == end) return val;
    }
}